

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxCommon.h
# Opt level: O0

char * Jinx::Impl::StrCopy(char *dest,size_t destBufferSize,char *source)

{
  char *source_local;
  size_t destBufferSize_local;
  char *dest_local;
  
  strncpy(dest,source,destBufferSize);
  return dest;
}

Assistant:

inline const char * StrCopy(char * dest, size_t destBufferSize, const char * source)
	{
#if defined(JINX_WINDOWS)
		strncpy_s(dest, destBufferSize, source, ((size_t)-1));
		return dest;
#else
		strncpy(dest, source, destBufferSize);
		return dest;
#endif
	}